

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

bool __thiscall
Clasp::ShortImplicationsGraph::propagateBin
          (ShortImplicationsGraph *this,Assignment *out,Literal p,uint32 level)

{
  pointer pIVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  Antecedent local_38;
  
  uVar6 = (ulong)(p.rep_ >> 1);
  pIVar1 = (this->graph_).ebo_.buf;
  uVar5 = (ulong)pIVar1[uVar6].super_ImpListBase.super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 left_;
  if (uVar5 == 0) {
    bVar3 = true;
  }
  else {
    lVar2 = (long)pIVar1[uVar6].super_ImpListBase.super_type.
                  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                  buf_;
    lVar4 = 0;
    do {
      local_38.data_ = uVar6 << 0x21 | 2;
      bVar3 = Assignment::assign(out,(Literal)*(uint32 *)(lVar2 + lVar4),level,&local_38);
      if (!bVar3) {
        return bVar3;
      }
      bVar7 = uVar5 - 4 != lVar4;
      lVar4 = lVar4 + 4;
    } while (bVar7);
  }
  return bVar3;
}

Assistant:

bool ShortImplicationsGraph::propagateBin(Assignment& out, Literal p, uint32 level) const {
	const ImplicationList& x = graph_[p.id()];
	Antecedent ante(p);
	for (ImplicationList::const_left_iterator it = x.left_begin(), end = x.left_end(); it != end; ++it) {
		if (!out.assign(*it, level, p)) { return false; }
	}
	return true;
}